

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_urlEncode(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  char cVar1;
  int iVar2;
  vm_obj_id_t obj;
  size_t sVar3;
  CVmObject *this;
  char *pcVar4;
  char *pcVar5;
  long in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  char c_1;
  char *dst;
  char c;
  size_t rem;
  char *p;
  size_t outlen;
  size_t len;
  CVmNativeCodeDesc *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  vm_val_t *in_stack_ffffffffffffff98;
  size_t local_58;
  char *local_50;
  
  if ((getp_urlEncode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_urlEncode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_urlEncode::desc,0);
    __cxa_guard_release(&getp_urlEncode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff98,
                     (uint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88);
  if (iVar2 == 0) {
    CVmStack::push(in_RSI);
    sVar3 = vmb_get_len((char *)0x390069);
    local_50 = (char *)(in_RDX + 2);
    for (local_58 = sVar3; local_58 != 0; local_58 = local_58 - 1) {
    }
    obj = create(in_stack_ffffffffffffff94,(size_t)in_RDI);
    vm_val_t::set_obj(in_RDI,obj);
    this = vm_objp(0);
    pcVar4 = cons_get_buf((CVmObjString *)this);
    for (local_58 = sVar3; local_58 != 0; local_58 = local_58 - 1) {
      cVar1 = *local_50;
      in_stack_ffffffffffffff94 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffff94);
      if (cVar1 == ' ') {
        pcVar5 = pcVar4 + 1;
        *pcVar4 = '+';
      }
      else if (((((cVar1 == '-') || (cVar1 == '_')) || (('`' < cVar1 && (cVar1 < '{')))) ||
               (('@' < cVar1 && (cVar1 < '[')))) || (('/' < cVar1 && (cVar1 < ':')))) {
        pcVar5 = pcVar4 + 1;
        *pcVar4 = cVar1;
      }
      else {
        pcVar5 = pcVar4 + 1;
        *pcVar4 = '%';
        byte_to_xdigits((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (uchar)((ulong)in_RDI >> 0x38));
        pcVar5 = pcVar5 + 2;
      }
      local_50 = local_50 + 1;
      pcVar4 = pcVar5;
    }
    CVmStack::discard(1);
  }
  return 1;
}

Assistant:

int CVmObjString::getp_urlEncode(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* save my own value for gc protection */
    G_stk->push(self_val);

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* scan the string and determine the size of the expansion */
    size_t outlen;
    const char *p;
    size_t rem;
    for (outlen = 0, p = str, rem = len ; rem != 0 ; ++p, --rem)
    {
        /* 
         *   if this is a space, letter, digit, or '-' or '_', it requires
         *   one byte in the output; otherwise it requires three bytes for
         *   the "%xx" sequence 
         */
        char c = *p;
        if (c == ' ' || c == '-' || c == '_'
            || (c >= 'a' && c <= 'z')
            || (c >= 'A' && c <= 'Z')
            || (c >= '0' && c <= '9'))
            outlen += 1;
        else
            outlen += 3;
    }

    /* allocate the return string */
    retval->set_obj(create(vmg_ FALSE, outlen));
    char *dst =
        ((CVmObjString *)vm_objp(vmg_ retval->val.obj))->cons_get_buf();

    /* build the return string */
    for (p = str, rem = len ; rem != 0 ; ++p, --rem)
    {
        /* translate this byte */
        char c = *p;
        if (c == ' ')
        {
            /* translate ' ' to '+' */
            *dst++ = '+';
        }
        else if (c == '-' || c == '_'
                 || (c >= 'a' && c <= 'z')
                 || (c >= 'A' && c <= 'Z')
                 || (c >= '0' && c <= '9'))
        {
            /* letter, digit, '-', '_' - leave unchanged */
            *dst++ = c;
        }
        else
        {
            /* translate anything else to a %xx sequence */
            *dst++ = '%';
            byte_to_xdigits(dst, (unsigned char)c);
            dst += 2;
        }
    }

    /* discard gc protection */
    G_stk->discard(1);

    /* done */
    return TRUE;
}